

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O1

void __thiscall
Deque<int,_std::allocator<int>_>::push_back(Deque<int,_std::allocator<int>_> *this,value_type *val)

{
  size_t sVar1;
  DataBlock **ppDVar2;
  DataBlock **ppDVar3;
  size_t sVar4;
  value_type *pvVar5;
  pointer piVar6;
  DataBlock *pDVar7;
  DataBlock **ppDVar8;
  
  sVar1 = (this->current_).size_;
  if (sVar1 != 0) {
    ppDVar2 = (this->current_).arr_;
    ppDVar3 = (this->current_).end_;
    ppDVar8 = ppDVar2 + (this->current_).allocSize_;
    if (ppDVar3 != ppDVar2) {
      ppDVar8 = ppDVar3;
    }
    if ((ulong)((long)ppDVar8[-1]->end - (long)ppDVar8[-1]->buffer) < 0x400) goto LAB_00126213;
  }
  if (sVar1 == (this->current_).allocSize_) {
    level_up(this);
  }
  piVar6 = (pointer)operator_new(0x400);
  pDVar7 = (DataBlock *)operator_new(0x18);
  pDVar7->buffer = piVar6;
  pDVar7->begin = piVar6;
  pDVar7->end = piVar6;
  sVar1 = (this->current_).size_;
  sVar4 = (this->current_).allocSize_;
  if (sVar1 != sVar4) {
    ppDVar2 = (this->current_).end_;
    (this->current_).end_ = ppDVar2 + 1;
    *ppDVar2 = pDVar7;
    (this->current_).size_ = sVar1 + 1;
    ppDVar2 = (this->current_).arr_;
    if ((long)(this->current_).end_ - (long)ppDVar2 >> 3 == sVar4) {
      (this->current_).end_ = ppDVar2;
    }
  }
  sVar1 = (this->small_).size_;
  sVar4 = (this->small_).allocSize_;
  if (sVar1 != sVar4) {
    ppDVar2 = (this->small_).end_;
    (this->small_).end_ = ppDVar2 + 1;
    *ppDVar2 = pDVar7;
    (this->small_).size_ = sVar1 + 1;
    ppDVar2 = (this->small_).arr_;
    if ((long)(this->small_).end_ - (long)ppDVar2 >> 3 == sVar4) {
      (this->small_).end_ = ppDVar2;
    }
  }
LAB_00126213:
  overtake(this);
  ppDVar2 = (this->current_).arr_;
  ppDVar3 = (this->current_).end_;
  ppDVar8 = ppDVar2 + (this->current_).allocSize_;
  if (ppDVar3 != ppDVar2) {
    ppDVar8 = ppDVar3;
  }
  pvVar5 = ppDVar8[-1]->end;
  ppDVar8[-1]->end = pvVar5 + 1;
  *pvVar5 = *val;
  return;
}

Assistant:

void push_back(const value_type &val) {
        if (current_.empty() || !current_.back()->can_push_back()) {
            if (current_.full()) {
                level_up();
            }
            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            DataBlock *block = new DataBlock(ptr);
            current_.push_back(block);
            if (!small_.full()) {
                small_.push_back(block);
            }
        }
        overtake();
        allocator_.construct(current_.back()->end++, val);
    }